

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Node::IsLeadingTrailingSpaces
          (Node *this,Compiler *compiler,CharCount *leftMinMatch,CharCount *rightMinMatch)

{
  _func_int **pp_Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  CharSet<char16_t> *pCVar7;
  bool local_71;
  MatchSetNode *rightSet;
  MatchSetNode *leftSet;
  LoopNode *rightLoop;
  LoopNode *leftLoop;
  ConcatNode *right;
  ConcatNode *left;
  AltNode *altNode;
  CharCount *rightMinMatch_local;
  CharCount *leftMinMatch_local;
  Compiler *compiler_local;
  Node *this_local;
  
  if (this->tag == Alt) {
    if ((compiler->program->flags & MultilineRegexFlag) == NoRegexFlags) {
      if ((((*(short *)(this[1]._vptr_Node + 1) == 6) &&
           (lVar2._0_2_ = this[1].tag, lVar2._2_2_ = this[1].features,
           lVar2._4_4_ = *(undefined4 *)&this[1].field_0xc, lVar2 != 0)) &&
          (*(short *)(*(long *)(*(long *)&this[1].tag + 0x38) + 8) == 6)) &&
         (*(long *)(*(long *)&this[1].tag + 0x40) == 0)) {
        pp_Var1 = this[1]._vptr_Node;
        lVar2 = *(long *)(*(long *)&this[1].tag + 0x38);
        if (((*(short *)(pp_Var1[7] + 8) == 1) && (pp_Var1[8] != (_func_int *)0x0)) &&
           ((*(short *)(*(long *)(pp_Var1[8] + 0x38) + 8) == 10 &&
            (*(long *)(pp_Var1[8] + 0x40) == 0)))) {
          if (((*(short *)(*(long *)(lVar2 + 0x38) + 8) == 10) && (*(long *)(lVar2 + 0x40) != 0)) &&
             ((*(short *)(*(long *)(*(long *)(lVar2 + 0x40) + 0x38) + 8) == 2 &&
              (*(long *)(*(long *)(lVar2 + 0x40) + 0x40) == 0)))) {
            lVar3 = *(long *)(pp_Var1[8] + 0x38);
            lVar2 = *(long *)(lVar2 + 0x38);
            if (((((*(byte *)(lVar3 + 0x4a) & 1) == 0) || (*(int *)(lVar3 + 0x44) != -1)) ||
                (*(short *)(*(long *)(lVar3 + 0x38) + 8) != 0xb)) ||
               ((((*(byte *)(lVar2 + 0x4a) & 1) == 0 || (*(int *)(lVar2 + 0x44) != -1)) ||
                (*(short *)(*(long *)(lVar2 + 0x38) + 8) != 0xb)))) {
              this_local._7_1_ = false;
            }
            else {
              lVar4 = *(long *)(lVar3 + 0x38);
              lVar5 = *(long *)(lVar2 + 0x38);
              if (((*(byte *)(lVar4 + 0x38) & 1) == 0) && ((*(byte *)(lVar5 + 0x38) & 1) == 0)) {
                *leftMinMatch = *(CharCount *)(lVar3 + 0x40);
                *rightMinMatch = *(CharCount *)(lVar2 + 0x40);
                pCVar7 = StandardChars<char16_t>::GetWhitespaceSet(compiler->standardChars);
                bVar6 = CharSet<char16_t>::IsEqualTo((CharSet<char16_t> *)(lVar4 + 0x40),pCVar7);
                local_71 = false;
                if (bVar6) {
                  pCVar7 = StandardChars<char16_t>::GetWhitespaceSet(compiler->standardChars);
                  local_71 = CharSet<char16_t>::IsEqualTo
                                       ((CharSet<char16_t> *)(lVar5 + 0x40),pCVar7);
                }
                this_local._7_1_ = local_71;
              }
              else {
                this_local._7_1_ = false;
              }
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Node::IsLeadingTrailingSpaces(Compiler& compiler, CharCount& leftMinMatch, CharCount& rightMinMatch) const
    {

        if (tag != Node::Alt)
            return false;

        if (compiler.program->flags & MultilineRegexFlag)
            return false;

        const AltNode* altNode = (const AltNode*)this;
        if (altNode->head->tag != Node::Concat ||
            altNode->tail == 0 ||
            altNode->tail->head->tag != Node::Concat ||
            altNode->tail->tail != 0)
            return false;

        const ConcatNode* left = (const ConcatNode*)altNode->head;
        const ConcatNode* right = (const ConcatNode*)altNode->tail->head;

        if (left->head->tag != Node::BOL ||
            left->tail == 0 ||
            left->tail->head->tag != Node::Loop ||
            left->tail->tail != 0)
            return false;

        if (right->head->tag != Node::Loop ||
            right->tail == 0 ||
            right->tail->head->tag != Node::EOL ||
            right->tail->tail != 0)
            return false;

        const LoopNode* leftLoop = (const LoopNode*)left->tail->head;
        const LoopNode* rightLoop = (const LoopNode*)right->head;

        if (!leftLoop->isGreedy ||
            leftLoop->repeats.upper != CharCountFlag ||
            leftLoop->body->tag != Node::MatchSet ||
            !rightLoop->isGreedy ||
            rightLoop->repeats.upper != CharCountFlag ||
            rightLoop->body->tag != Node::MatchSet)
            return false;

        const MatchSetNode* leftSet = (const MatchSetNode*)leftLoop->body;
        const MatchSetNode* rightSet = (const MatchSetNode*)rightLoop->body;

        if (leftSet->isNegation ||
            rightSet->isNegation)
            return false;

        leftMinMatch = leftLoop->repeats.lower;
        rightMinMatch = rightLoop->repeats.lower;

        return
            leftSet->set.IsEqualTo(*compiler.standardChars->GetWhitespaceSet()) &&
            rightSet->set.IsEqualTo(*compiler.standardChars->GetWhitespaceSet());
    }